

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processValueConstraint
          (PSVIWriterHandlers *this,VALUE_CONSTRAINT valueConstraintType,XMLCh *constraintValue)

{
  XMLCh *value;
  XMLCh *constraintValue_local;
  VALUE_CONSTRAINT valueConstraintType_local;
  PSVIWriterHandlers *this_local;
  
  if (valueConstraintType == VALUE_CONSTRAINT_NONE) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
  }
  else {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
    value = translateValueConstraint(this,valueConstraintType);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgVariety,value);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,constraintValue);
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValueConstraint);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processValueConstraint(XSConstants::VALUE_CONSTRAINT valueConstraintType, const XMLCh* constraintValue) {
	if (valueConstraintType == XSConstants::VALUE_CONSTRAINT_NONE) {
		sendElementEmpty(PSVIUni::fgValueConstraint);
	} else {
		sendIndentedElement(PSVIUni::fgValueConstraint);
		sendElementValue(PSVIUni::fgVariety, translateValueConstraint(valueConstraintType));
		sendElementValue(PSVIUni::fgValue, constraintValue);
		sendUnindentedElement(PSVIUni::fgValueConstraint);
	}
}